

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeModel::itemChanged(QTreeModel *this,QTreeWidgetItem *item)

{
  int iVar1;
  int in_ESI;
  QTreeModel *in_RDI;
  long in_FS_OFFSET;
  QModelIndex right;
  QModelIndex left;
  SkipSorting skipSorting;
  undefined1 local_60 [24];
  undefined1 local_48 [16];
  QTreeWidgetItem *local_38;
  undefined1 local_30 [16];
  QTreeWidgetItem *local_20;
  undefined1 local_18 [16];
  QModelIndex *local_8;
  
  local_8 = *(QModelIndex **)(in_FS_OFFSET + 0x28);
  iVar1 = QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x91184a);
  if (0 < iVar1) {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    SkipSorting::SkipSorting((SkipSorting *)local_18,in_RDI);
    local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    index((QTreeModel *)local_30,(char *)in_RDI,in_ESI);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    QTreeWidgetItem::columnCount((QTreeWidgetItem *)0x9118ed);
    index((QTreeModel *)local_48,(char *)in_RDI,in_ESI);
    memset(local_60,0,0x18);
    QList<int>::QList((QList<int> *)0x911921);
    QAbstractItemModel::dataChanged
              ((QModelIndex *)in_RDI,(QModelIndex *)local_30,(QList_conflict2 *)local_48);
    QList<int>::~QList((QList<int> *)0x911944);
    SkipSorting::~SkipSorting((SkipSorting *)local_18);
  }
  if (*(QModelIndex **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeModel::itemChanged(QTreeWidgetItem *item)
{
    if (item->columnCount() <= 0)
        return;
    SkipSorting skipSorting(this); //this is kind of wrong, but not doing this would kill performance
    QModelIndex left = index(item, 0);
    QModelIndex right = index(item, item->columnCount() - 1);
    emit dataChanged(left, right);
}